

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O2

int __thiscall TPZSubMeshAnalysis::ClassId(TPZSubMeshAnalysis *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZSubMeshAnalysis",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZLinearAnalysis::ClassId(&this->super_TPZLinearAnalysis);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZSubMeshAnalysis::ClassId() const{
    return Hash("TPZSubMeshAnalysis") ^ TPZLinearAnalysis::ClassId() << 1;
}